

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

void http_on_close_client(intptr_t uuid,fio_protocol_s *protocol)

{
  http_settings_s *s;
  
  s = (http_settings_s *)protocol[1].on_ready;
  if (s->on_finish != (_func_void_http_settings_s_ptr *)0x0) {
    (*s->on_finish)(s);
  }
  (*s[1].on_request)((http_s *)uuid);
  http_settings_free(s);
  return;
}

Assistant:

static void http_on_close_client(intptr_t uuid, fio_protocol_s *protocol) {
  http_fio_protocol_s *p = (http_fio_protocol_s *)protocol;
  http_settings_s *set = p->settings;
  void (**original)(intptr_t, fio_protocol_s *) =
      (void (**)(intptr_t, fio_protocol_s *))(set + 1);
  if (set->on_finish)
    set->on_finish(set);

  original[0](uuid, protocol);
  http_settings_free(set);
}